

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O2

bool Js::InlinedFrameWalker::FromPhysicalFrame
               (InlinedFrameWalker *self,StackFrame *physicalFrame,ScriptFunction *parent,
               bool fromBailout,int loopNum,JavascriptStackWalker *stackWalker,
               bool useInternalFrameInfo,bool noAlloc)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  int frameCount;
  FunctionBody *pFVar4;
  undefined4 *puVar5;
  FunctionEntryPointInfo *this;
  void *entry;
  InlinedFrameLayout *outerMostFrame;
  InlineeFrameRecord *this_00;
  Memory *this_01;
  InlinedFrame **frames;
  InlinedFrameLayout *pIVar6;
  uint uVar7;
  uint uVar8;
  void *returnAddress;
  undefined1 local_78 [8];
  TrackAllocData data;
  void **local_40;
  
  data._32_8_ = self;
  pFVar4 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)parent);
  if (stackWalker == (JavascriptStackWalker *)0x0 && loopNum != -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                ,0x4ee,"(stackWalker)","stackWalker");
    if (!bVar2) goto LAB_009d2f3e;
    *puVar5 = 0;
  }
  if (useInternalFrameInfo && loopNum != -1) {
    returnAddress = (stackWalker->lastInternalFrameInfo).codeAddress;
    if (returnAddress == (void *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                  ,0x4f5,
                                  "(stackWalker->GetCachedInternalFrameInfo().codeAddress != nullptr)"
                                  ,
                                  "stackWalker->GetCachedInternalFrameInfo().codeAddress != nullptr"
                                 );
      if (!bVar2) goto LAB_009d2f3e;
      *puVar5 = 0;
      returnAddress = (stackWalker->lastInternalFrameInfo).codeAddress;
    }
    local_40 = (void **)(stackWalker->lastInternalFrameInfo).framePointer;
LAB_009d2d38:
    this = (FunctionEntryPointInfo *)
           FunctionBody::GetLoopEntryPointInfoFromNativeAddress
                     (pFVar4,(DWORD_PTR)returnAddress,loopNum);
  }
  else {
    local_40 = physicalFrame->frame;
    returnAddress = physicalFrame->codeAddr;
    if (loopNum != -1) goto LAB_009d2d38;
    this = FunctionBody::GetEntryPointFromNativeAddress(pFVar4,(DWORD_PTR)returnAddress);
  }
  if (this == (FunctionEntryPointInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                ,0x50a,"(entryPointInfo != nullptr)",
                                "Inlined frame should resolve to the right parent address");
    if (!bVar2) {
LAB_009d2f3e:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  bVar2 = EntryPointInfo::HasInlinees(&this->super_EntryPointInfo);
  if (bVar2) {
    entry = (void *)EntryPointInfo::GetNativeAddress(&this->super_EntryPointInfo);
    outerMostFrame =
         &InlinedFrame::FromPhysicalFrame
                    (physicalFrame,stackWalker,entry,&this->super_EntryPointInfo,
                     useInternalFrameInfo)->super_InlinedFrameLayout;
    if (outerMostFrame != (InlinedFrameLayout *)0x0) {
      if ((!fromBailout) &&
         (this_00 = EntryPointInfo::FindInlineeFrame(&this->super_EntryPointInfo,returnAddress),
         this_00 != (InlineeFrameRecord *)0x0)) {
        pFVar4 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)parent);
        InlineeFrameRecord::RestoreFrames
                  (this_00,pFVar4,outerMostFrame,(JavascriptCallStackLayout *)(local_40 + 2),false);
      }
      uVar7 = *(uint *)&outerMostFrame->callInfo;
      bVar2 = (uVar7 & 0xf) != 0;
      if (!bVar2 || noAlloc) {
        return bVar2;
      }
      uVar8 = 0xffffffff;
      pIVar6 = outerMostFrame;
      while ((uVar7 & 0xf) != 0) {
        pIVar6 = (InlinedFrameLayout *)(&pIVar6[1].callInfo + (uVar7 & 0xf));
        uVar8 = uVar8 + 1;
        uVar7 = *(uint *)&pIVar6->callInfo;
      }
      frameCount = uVar8 + 1;
      local_78 = (undefined1  [8])&InlinedFrame*::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.count = (size_t)anon_var_dwarf_4dfd6e0;
      data.filename._0_4_ = 0x52e;
      data.plusSize = (long)frameCount;
      this_01 = (Memory *)
                Memory::HeapAllocator::TrackAllocInfo
                          (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_78);
      frames = Memory::
               AllocateArray<Memory::HeapAllocator,Js::InlinedFrameWalker::InlinedFrame*,false>
                         (this_01,(HeapAllocator *)Memory::HeapAllocator::Alloc,0,(long)frameCount);
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      do {
        if ((int)uVar8 < 0) {
          Initialize((InlinedFrameWalker *)data._32_8_,frameCount,frames,parent);
          return bVar2;
        }
        if (outerMostFrame == (InlinedFrameLayout *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar5 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                      ,0x533,"(frameIterator)","frameIterator");
          if (!bVar3) goto LAB_009d2f3e;
          *puVar5 = 0;
        }
        frames[uVar8] = (InlinedFrame *)outerMostFrame;
        outerMostFrame =
             (InlinedFrameLayout *)
             (&outerMostFrame[1].callInfo + (*(uint *)&outerMostFrame->callInfo & 0xf));
        uVar8 = uVar8 - 1;
      } while( true );
    }
  }
  return false;
}

Assistant:

bool InlinedFrameWalker::FromPhysicalFrame(InlinedFrameWalker& self, StackFrame& physicalFrame, Js::ScriptFunction *parent, bool fromBailout,
        int loopNum, const JavascriptStackWalker * const stackWalker, bool useInternalFrameInfo, bool noAlloc)
    {
        bool inlinedFramesFound = false;
        FunctionBody* parentFunctionBody = parent->GetFunctionBody();
        EntryPointInfo *entryPointInfo;

        if (loopNum != -1)
        {
            Assert(stackWalker);
        }

        void *nativeCodeAddress = nullptr;
        void *framePointer = nullptr;
        if (loopNum != -1 && useInternalFrameInfo)
        {
            Assert(stackWalker->GetCachedInternalFrameInfo().codeAddress != nullptr);
            InternalFrameInfo lastInternalFrameInfo = stackWalker->GetCachedInternalFrameInfo();

            nativeCodeAddress = lastInternalFrameInfo.codeAddress;
            framePointer = lastInternalFrameInfo.framePointer;
        }
        else
        {
            nativeCodeAddress = physicalFrame.GetInstructionPointer();
            framePointer = physicalFrame.GetFrame();
        }

        if (loopNum != -1)
        {
            entryPointInfo = (Js::EntryPointInfo*)parentFunctionBody->GetLoopEntryPointInfoFromNativeAddress((DWORD_PTR)nativeCodeAddress, loopNum);
        }
        else
        {
            entryPointInfo = (Js::EntryPointInfo*)parentFunctionBody->GetEntryPointFromNativeAddress((DWORD_PTR)nativeCodeAddress);
        }

        AssertMsg(entryPointInfo != nullptr, "Inlined frame should resolve to the right parent address");
        if (entryPointInfo->HasInlinees())
        {
            void *entry = reinterpret_cast<void*>(entryPointInfo->GetNativeAddress());
            InlinedFrameWalker::InlinedFrame *outerMostFrame = InlinedFrame::FromPhysicalFrame(physicalFrame, stackWalker, entry, entryPointInfo, useInternalFrameInfo);

            if (!outerMostFrame)
            {
                return inlinedFramesFound;
            }

            if (!fromBailout)
            {
                InlineeFrameRecord* record = entryPointInfo->FindInlineeFrame((void*)nativeCodeAddress);

                if (record)
                {
                    record->RestoreFrames(parent->GetFunctionBody(), outerMostFrame, JavascriptCallStackLayout::FromFramePointer(framePointer), false /* boxValues */);
                }
            }

            if (outerMostFrame->callInfo.Count)
            {
                inlinedFramesFound = true;
                if (noAlloc)
                {
                    return inlinedFramesFound;
                }
                int32 frameCount = 0;
                InlinedFrameWalker::InlinedFrame *frameIterator = outerMostFrame;
                while (frameIterator->callInfo.Count)
                {
                    frameCount++;
                    frameIterator = frameIterator->Next();
                }

                InlinedFrameWalker::InlinedFrame **frames = HeapNewArray(InlinedFrameWalker::InlinedFrame*, frameCount);

                frameIterator = outerMostFrame;
                for (int index = frameCount - 1; index >= 0; index--)
                {
                    Assert(frameIterator);
                    frames[index] = frameIterator;
                    frameIterator = frameIterator->Next();
                }

                self.Initialize(frameCount, frames, parent);
            }

        }

        return inlinedFramesFound;
    }